

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>),libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  undefined1 local_98 [40];
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> local_70;
  session_impl *local_68;
  session_impl *ses;
  error_code_enum local_4c;
  undefined1 local_48 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a_local;
  offset_in_torrent_to_subr f_local;
  torrent_handle *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RCX;
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  if (!bVar1) {
    local_4c = invalid_torrent_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_4c);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
  local_68 = (session_impl *)libtorrent::aux::torrent::session(this_00);
  ctx = libtorrent::aux::session_impl::get_context(local_68);
  local_98._0_8_ = local_68;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)(local_98 + 8),
             (shared_ptr<libtorrent::aux::torrent> *)local_48);
  local_70.m_val =
       *(uint *)&(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base;
  local_98._24_8_ = f;
  local_98._32_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>),libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&>(void(libtorrent::aux::torrent::*)(libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>),libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::status_flags_tag,void>const&)const::_lambda()_1_>
            (ctx,(type_conflict9 *)local_98,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)local_98);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_48);
  return;
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}